

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void forbody(LexState *ls,int base,int line,int nvars,int isnum,Fornuminfo *info)

{
  FuncState *fs_00;
  int local_5c;
  int local_58;
  int endfor;
  int prep;
  FuncState *fs;
  OpCode forloop_inst;
  OpCode forprep_inst;
  BlockCnt bl;
  Fornuminfo *info_local;
  int isnum_local;
  int nvars_local;
  int line_local;
  int base_local;
  LexState *ls_local;
  
  fs._4_4_ = OP_FORPREP;
  fs._0_4_ = OP_FORLOOP;
  fs_00 = ls->fs;
  bl._16_8_ = info;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (isnum != 0) {
    (ls->fs->f->ravi_jit).jit_flags = '\x01';
    if (((bl._16_8_ == 0) || (*(int *)(bl._16_8_ + 4) == 0)) || (*(int *)(bl._16_8_ + 8) < 2)) {
      if (((bl._16_8_ != 0) && (*(int *)(bl._16_8_ + 4) != 0)) && (*(int *)(bl._16_8_ + 8) == 1)) {
        fs._4_4_ = OP_RAVI_FORPREP_I1;
        fs._0_4_ = OP_RAVI_FORLOOP_I1;
      }
    }
    else {
      fs._4_4_ = OP_RAVI_FORPREP_IP;
      fs._0_4_ = OP_RAVI_FORLOOP_IP;
    }
  }
  if (isnum == 0) {
    local_5c = luaK_jump(fs_00);
  }
  else {
    local_5c = luaK_codeABx(fs_00,fs._4_4_,base,0x7fff);
  }
  enterblock(fs_00,(BlockCnt *)&forloop_inst,'\0');
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs_00,nvars);
  block(ls);
  leaveblock(fs_00);
  luaK_patchtohere(fs_00,local_5c);
  if (isnum == 0) {
    luaK_codeABC(fs_00,OP_TFORCALL,base,0,nvars);
    luaK_fixline(fs_00,line);
    local_58 = luaK_codeABx(fs_00,OP_TFORLOOP,base + 2,0x7fff);
  }
  else {
    local_58 = luaK_codeABx(fs_00,(OpCode)fs,base,0x7fff);
  }
  luaK_patchlist(fs_00,local_58,local_5c + 1);
  luaK_fixline(fs_00,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum, Fornuminfo *info) {
  /* forbody -> DO block */
  BlockCnt bl;
  OpCode forprep_inst = OP_FORPREP, forloop_inst = OP_FORLOOP;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  if (isnum) {
    ls->fs->f->ravi_jit.jit_flags = RAVI_JIT_FLAG_HASFORLOOP;
    if (info && info->is_constant && info->int_value > 1) {
      forprep_inst = OP_RAVI_FORPREP_IP;
      forloop_inst = OP_RAVI_FORLOOP_IP;
    }
    else if (info && info->is_constant && info->int_value == 1) {
      forprep_inst = OP_RAVI_FORPREP_I1;
      forloop_inst = OP_RAVI_FORLOOP_I1;
    }
  }
  prep = isnum ? luaK_codeAsBx(fs, forprep_inst, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, forloop_inst, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}